

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O2

ValueHolder *
testing::internal::
CheckedDowncastToActualType<testing::internal::ThreadLocal<std::vector<testing::internal::TraceInfo,std::allocator<testing::internal::TraceInfo>>>::ValueHolder,testing::internal::ThreadLocalValueHolderBase>
          (ThreadLocalValueHolderBase *base)

{
  bool bVar1;
  ValueHolder *pVVar2;
  undefined8 uVar3;
  GTestLog local_c;
  
  if (base != (ThreadLocalValueHolderBase *)0x0) {
    bVar1 = std::type_info::operator==
                      ((type_info *)base->_vptr_ThreadLocalValueHolderBase[-1],
                       (type_info *)
                       &ThreadLocal<std::vector<testing::internal::TraceInfo,std::allocator<testing::internal::TraceInfo>>>
                        ::ValueHolder::typeinfo);
    if (!bVar1) {
      GTestLog::GTestLog(&local_c,GTEST_FATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/ext/gtest/gtest.h"
                         ,0x8d2);
      std::operator<<((ostream *)&std::cerr,"Condition typeid(*base) == typeid(Derived) failed. ");
      GTestLog::~GTestLog(&local_c);
    }
    pVVar2 = (ValueHolder *)
             __dynamic_cast(base,&ThreadLocalValueHolderBase::typeinfo,
                            &ThreadLocal<std::vector<testing::internal::TraceInfo,std::allocator<testing::internal::TraceInfo>>>
                             ::ValueHolder::typeinfo,0);
    return pVVar2;
  }
  uVar3 = __cxa_bad_typeid();
  GTestLog::~GTestLog(&local_c);
  _Unwind_Resume(uVar3);
}

Assistant:

Derived* CheckedDowncastToActualType(Base* base) {
#if GTEST_HAS_RTTI
  GTEST_CHECK_(typeid(*base) == typeid(Derived));
  return dynamic_cast<Derived*>(base);  // NOLINT
#else
  return static_cast<Derived*>(base);  // Poor man's downcast.
#endif
}